

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O0

int testSimpleNNShapeBadOutput(void)

{
  bool bVar1;
  ResultType RVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  InnerProductLayerParams *this_01;
  WeightParams *this_02;
  ostream *poVar7;
  undefined1 local_b8 [8];
  Result res;
  int i;
  InnerProductLayerParams *innerProductParams;
  NeuralNetworkLayer *innerProductLayer;
  NeuralNetwork *nn;
  ArrayFeatureType *outshape;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar4 = CoreML::Specification::ModelDescription::add_input(pMVar3);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"input");
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,4);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar4 = CoreML::Specification::ModelDescription::add_output(pMVar3);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"output");
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,2);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(this_00);
  CoreML::Specification::InnerProductLayerParams::set_inputchannels(this_01,4);
  CoreML::Specification::InnerProductLayerParams::set_outputchannels(this_01,3);
  for (res.m_message.field_2._12_4_ = 0; (int)res.m_message.field_2._12_4_ < 0xc;
      res.m_message.field_2._12_4_ = res.m_message.field_2._12_4_ + 1) {
    this_02 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_01);
    CoreML::Specification::WeightParams::add_floatvalue(this_02,1.0);
  }
  CoreML::Specification::InnerProductLayerParams::set_hasbias(this_01,false);
  CoreML::validate<(MLModelType)500>((Result *)local_b8,(Model *)&topIn);
  bVar1 = CoreML::Result::good((Result *)local_b8);
  if (bVar1) {
    RVar2 = CoreML::Result::type((Result *)local_b8);
    if (RVar2 == POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES) {
      m1._oneof_case_[0] = 0;
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x82);
      poVar7 = std::operator<<(poVar7,": error: ");
      poVar7 = std::operator<<(poVar7,
                               "res.type() == ResultType::POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES"
                              );
      poVar7 = std::operator<<(poVar7," was false, expected true.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x81);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"(res).good()");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  CoreML::Result::~Result((Result *)local_b8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testSimpleNNShapeBadOutput() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(4);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(2);

    auto *nn = m1.mutable_neuralnetwork();

    // The parameters of the layer don't match the network inputs & outputs
    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(4);
    innerProductParams->set_outputchannels(3);
    for (int i = 0; i < 12; i++) {
        innerProductParams->mutable_weights()->add_floatvalue(1.0);
    }

    innerProductParams->set_hasbias(false);

    // This is not valid from the perspective of the shapes in the network, but that is being raised as
    // a warning instead of being an invalid model.
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    ML_ASSERT(res.type() == ResultType::POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES);

    return 0;

}